

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

void __thiscall cmUVProcessChain::cmUVProcessChain(cmUVProcessChain *this)

{
  pointer pIVar1;
  cmUVProcessChain *this_local;
  
  std::make_unique<cmUVProcessChain::InternalData>();
  pIVar1 = std::
           unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
           ::operator->(&this->Data);
  ::cm::uv_loop_ptr::init(&pIVar1->Loop,(EVP_PKEY_CTX *)0x0);
  return;
}

Assistant:

cmUVProcessChain::cmUVProcessChain()
  : Data(cm::make_unique<InternalData>())
{
  this->Data->Loop.init();
}